

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

void __thiscall
testing::internal::
FlatTupleBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_>
::~FlatTupleBase(FlatTupleBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_>
                 *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->
           super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_5UL>
           ).value.input_foo_proto._M_dataplus._M_p;
  paVar2 = &(this->
            super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_5UL>
            ).value.input_foo_proto.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->
           super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_4UL>
           ).value.input_foo_proto._M_dataplus._M_p;
  paVar2 = &(this->
            super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_4UL>
            ).value.input_foo_proto.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->
           super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_3UL>
           ).value.input_foo_proto._M_dataplus._M_p;
  paVar2 = &(this->
            super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_3UL>
            ).value.input_foo_proto.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->
           super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_2UL>
           ).value.input_foo_proto._M_dataplus._M_p;
  paVar2 = &(this->
            super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_2UL>
            ).value.input_foo_proto.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->
           super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_1UL>
           ).value.input_foo_proto._M_dataplus._M_p;
  paVar2 = &(this->
            super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_1UL>
            ).value.input_foo_proto.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->
           super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_0UL>
           ).value.input_foo_proto._M_dataplus._M_p;
  paVar2 = &(this->
            super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_0UL>
            ).value.input_foo_proto.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

FlatTupleBase() = default;